

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  int *piVar1;
  undefined1 *puVar2;
  DictWord *pDVar3;
  long lVar4;
  DictWord *pDVar5;
  DictWord *pDVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  long lVar15;
  uint64_t uVar16;
  uint16_t *puVar17;
  long lVar18;
  long lVar19;
  uint16_t *puVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  size_t sVar24;
  uint uVar25;
  uint uVar28;
  ulong uVar29;
  int iVar26;
  int iVar27;
  DictWord *pDVar30;
  undefined8 uVar31;
  void *pvVar32;
  ulong uVar33;
  undefined1 *puVar34;
  byte bVar35;
  DictWord *pDVar36;
  long lVar37;
  ulong uVar38;
  size_t *psVar39;
  ulong uVar40;
  uint8_t *puVar41;
  uint8_t *puVar42;
  short sVar43;
  uint uVar44;
  size_t *psVar45;
  size_t sVar46;
  long lVar47;
  DictWord *pDVar48;
  ulong uVar49;
  DictWord *pDVar50;
  ulong uVar51;
  uint uVar52;
  ulong uVar54;
  uint uVar53;
  ulong uVar55;
  ulong uVar56;
  DictWord *pDVar57;
  undefined1 *puVar58;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  int iVar62;
  uint32_t *buckets;
  long lVar63;
  ulong uVar64;
  int last_distance;
  ulong uVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  ulong local_168;
  ulong local_160;
  ulong local_158;
  DictWord *local_138;
  ulong local_120;
  ulong local_100;
  int local_f0;
  DictWord *local_d8;
  ulong local_d0;
  DictWord *local_b0;
  size_t *local_a8;
  uint8_t *local_98;
  ulong local_88;
  int local_78;
  
  bVar35 = literal_context_lut[8];
  lVar15 = *(long *)(literal_context_lut + 0x10);
  pDVar5 = (DictWord *)((position - 7) + num_bytes);
  pDVar36 = (DictWord *)position;
  if (7 < num_bytes) {
    pDVar36 = pDVar5;
  }
  lVar37 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar37 = 0x40;
  }
  local_d0 = *(ulong *)dist_cache;
  pDVar3 = (DictWord *)(position + num_bytes);
  uVar53 = *(uint *)&(params->dictionary).words;
  if (4 < (int)uVar53) {
    iVar62 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar62 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar62 + 1;
    (hasher->common).params.type = iVar62 + -2;
    (hasher->common).params.bucket_bits = iVar62 + 2;
    (hasher->common).params.block_bits = iVar62 + -3;
    (hasher->common).params.hash_len = iVar62 + 3;
    if (10 < uVar53) {
      iVar62 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar62 + -1;
      (hasher->common).is_prepared_ = iVar62 + 1;
      *(int *)&hasher->privat = iVar62 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar62 + 2;
      (hasher->privat)._H5.block_size_ = CONCAT44(iVar62 + 3,iVar62 + -3);
    }
  }
  if (pDVar3 <= (DictWord *)(position + 8)) {
    local_a8 = last_insert_len;
LAB_00112398:
    *(undefined1 **)dist_cache = (undefined1 *)((long)pDVar3 + (local_d0 - position));
    *(long *)commands = *(long *)commands + ((long)local_a8 - (long)last_insert_len >> 4);
    return;
  }
  pDVar6 = (DictWord *)((1L << (bVar35 & 0x3f)) - 0x10);
  local_98 = (uint8_t *)(lVar37 + position);
  lVar4 = position - 1;
  local_a8 = last_insert_len;
  auVar67 = _DAT_0013b100;
LAB_0011014a:
  uVar29 = (long)pDVar3 - position;
  pDVar57 = pDVar6;
  if (position < pDVar6) {
    pDVar57 = (DictWord *)position;
  }
  local_b0 = (DictWord *)(&((DictWord *)position)->len + lVar15);
  if (pDVar6 <= (DictWord *)(&((DictWord *)position)->len + lVar15)) {
    local_b0 = pDVar6;
  }
  pDVar48 = *(DictWord **)(literal_context_lut + 0x50);
  uVar16 = (params->dictionary).cutoffTransforms;
  puVar17 = (params->dictionary).hash_table_words;
  uVar54 = position & ringbuffer_mask;
  psVar45 = *(size_t **)backward_references;
  uVar44 = (uint)ringbuffer_mask;
  uVar53 = (uint)uVar29;
  if (psVar45 < back_refs_position) {
    pDVar30 = (DictWord *)(long)(int)num_literals[(long)psVar45 * 2];
    if (pDVar30 < position) {
      psVar39 = num_literals + (long)psVar45 * 2;
      do {
        psVar45 = (size_t *)((long)psVar45 + 1);
        if (back_refs_position == psVar45) {
          *(size_t **)backward_references = psVar45;
          bVar66 = false;
          psVar45 = back_refs_position;
          goto LAB_00110289;
        }
        pDVar30 = (DictWord *)(long)(int)psVar39[2];
        psVar39 = psVar39 + 2;
      } while (pDVar30 < position);
      *(size_t **)backward_references = psVar45;
      bVar66 = psVar45 < back_refs_position;
    }
    else {
      psVar39 = num_literals + (long)psVar45 * 2;
      bVar66 = true;
    }
    if ((DictWord *)position != pDVar30) {
LAB_00110289:
      bVar22 = false;
      goto LAB_00110291;
    }
    uVar52 = (uint)psVar39[1];
    local_d8 = (DictWord *)(long)(int)uVar52;
    if ((position <= (DictWord *)(position - (long)local_d8)) ||
       (*(uint *)((long)psVar39 + 0xc) < uVar52)) {
      local_100 = 0;
      local_d8 = (DictWord *)0x0;
LAB_00110822:
      local_120 = 0x7e4;
      bVar23 = true;
      if ((DictWord *)position == pDVar30) {
        uVar52 = (uint)num_literals[(long)psVar45 * 2 + 1];
        if (*(int *)((long)num_literals + (long)psVar45 * 0x10 + 0xc) < (int)uVar52) {
          uVar59 = *(uint *)((long)num_literals + (long)psVar45 * 0x10 + 4);
          uVar60 = (ulong)uVar59;
          if (uVar59 - 4 < 0x15 && (int)uVar52 < 0x7ffffffd) {
            uVar25 = ~(uint)pDVar57 + uVar52;
            lVar47 = *(long *)(literal_context_lut + 0x58);
            iVar62 = (int)uVar25 >> (*(byte *)(lVar47 + uVar60) & 0x1f);
            if (iVar62 < *(int *)(literal_context_lut + 0x60)) {
              uVar28 = *(uint *)(lVar47 + 0x20 + uVar60 * 4);
              uVar10 = kBitMask[*(byte *)(lVar47 + uVar60)];
              lVar47 = *(long *)(lVar47 + 0xa8);
              uVar31 = BrotliGetTransforms();
              pvVar32 = malloc(uVar60 * 10);
              iVar26 = BrotliTransformDictionaryWord
                                 (pvVar32,(ulong)uVar28 + lVar47 +
                                          (long)(int)((uVar25 & uVar10) * uVar59),uVar60,uVar31,
                                  iVar62);
              sVar46 = (size_t)iVar26;
              iVar27 = bcmp(ringbuffer + uVar54,pvVar32,sVar46);
              bVar22 = false;
              bVar23 = false;
              iVar62 = 0;
              auVar67 = _DAT_0013b100;
              if (iVar27 == 0) {
                iVar62 = 0x1f;
                if (uVar52 != 0) {
                  for (; uVar52 >> iVar62 == 0; iVar62 = iVar62 + -1) {
                  }
                }
                local_120 = (ulong)(iVar62 * -0x1e + 0x780) + sVar46 * 0x87;
                iVar62 = uVar59 - iVar26;
                bVar22 = false;
                bVar23 = false;
                local_100 = sVar46;
                local_d8 = (DictWord *)(long)(int)uVar52;
              }
              goto LAB_00110d26;
            }
          }
          bVar23 = false;
        }
      }
LAB_00110d14:
      bVar22 = false;
      local_120 = 0x7e4;
      goto LAB_00110d1c;
    }
    uVar60 = (ulong)(position - (long)local_d8) & ringbuffer_mask;
    if (7 < uVar29) {
      uVar38 = uVar29 & 0xfffffffffffffff8;
      puVar42 = ringbuffer + uVar38 + uVar54;
      lVar47 = 0;
      uVar33 = 0;
LAB_00110c6f:
      uVar65 = *(ulong *)(ringbuffer + uVar54 + uVar33 * 8);
      if (uVar65 == *(ulong *)(ringbuffer + uVar33 * 8 + uVar60)) goto code_r0x00110c7c;
      uVar65 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar60) ^ uVar65;
      uVar60 = 0;
      if (uVar65 != 0) {
        for (; (uVar65 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
        }
      }
      uVar33 = (uVar60 >> 3 & 0x1fffffff) - lVar47;
      goto LAB_00110cb7;
    }
    uVar38 = 0;
    puVar42 = ringbuffer + uVar54;
LAB_00112358:
    uVar65 = uVar29 & 7;
    uVar33 = uVar38;
    if (uVar65 != 0) {
      uVar56 = uVar38 | uVar65;
      do {
        uVar33 = uVar38;
        if (ringbuffer[uVar38 + uVar60] != *puVar42) break;
        puVar42 = puVar42 + 1;
        uVar38 = uVar38 + 1;
        uVar65 = uVar65 - 1;
        uVar33 = uVar56;
      } while (uVar65 != 0);
    }
LAB_00110cb7:
    local_100 = (ulong)*(int *)((long)num_literals + (long)psVar45 * 0x10 + 4);
    if (uVar33 < local_100) {
      local_100 = uVar33;
    }
    iVar62 = 0x1f;
    if (uVar52 != 0) {
      for (; uVar52 >> iVar62 == 0; iVar62 = iVar62 + -1) {
      }
    }
    local_120 = (ulong)(iVar62 * -0x1e + 0x780) + local_100 * 0x87;
    bVar22 = false;
    bVar23 = false;
    iVar62 = 0;
  }
  else {
    bVar66 = false;
    bVar22 = back_refs_position == (size_t *)0x0;
LAB_00110291:
    uVar60 = (ulong)*(int *)&(params->dictionary).words;
    if (uVar60 == 0) {
      local_120 = 0x7e4;
      local_d8 = (DictWord *)0x0;
      local_100 = 0;
      uVar38 = 0;
    }
    else {
      puVar42 = ringbuffer + uVar54;
      uVar33 = (ulong)(uVar53 & 7);
      local_120 = 0x7e4;
      uVar38 = 0;
      uVar65 = 0;
      local_100 = 0;
      local_d8 = (DictWord *)0x0;
      do {
        pDVar30 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + uVar65 * 4);
        if (((pDVar30 <= pDVar57) && ((DictWord *)(position - (long)pDVar30) < position)) &&
           (uVar38 + uVar54 <= ringbuffer_mask)) {
          uVar56 = (ulong)(position - (long)pDVar30) & ringbuffer_mask;
          if ((uVar56 + uVar38 <= ringbuffer_mask) &&
             (ringbuffer[uVar38 + uVar54] == ringbuffer[uVar56 + uVar38])) {
            if (7 < uVar29) {
              lVar47 = 0;
              uVar40 = 0;
LAB_0011037c:
              if (*(ulong *)(puVar42 + uVar40 * 8) == *(ulong *)(ringbuffer + uVar40 * 8 + uVar56))
              goto code_r0x0011038e;
              uVar40 = *(ulong *)(ringbuffer + uVar40 * 8 + uVar56) ^
                       *(ulong *)(puVar42 + uVar40 * 8);
              uVar56 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                }
              }
              uVar40 = (uVar56 >> 3 & 0x1fffffff) - lVar47;
              goto LAB_001103ed;
            }
            uVar61 = 0;
            puVar41 = puVar42;
LAB_0011048e:
            uVar40 = uVar61;
            if (uVar33 != 0) {
              uVar64 = uVar33 | uVar61;
              uVar55 = uVar33;
              do {
                uVar40 = uVar61;
                if (ringbuffer[uVar61 + uVar56] != *puVar41) break;
                puVar41 = puVar41 + 1;
                uVar61 = uVar61 + 1;
                uVar55 = uVar55 - 1;
                uVar40 = uVar64;
              } while (uVar55 != 0);
            }
LAB_001103ed:
            if ((bVar66) &&
               ((undefined1 *)(long)(int)num_literals[(long)psVar45 * 2] <
                &((DictWord *)position)->len + uVar40)) {
              uVar40 = (long)(int)num_literals[(long)psVar45 * 2] - position;
            }
            if (((2 < uVar40) || ((uVar65 < 2 && (uVar40 == 2)))) &&
               (uVar56 = uVar40 * 0x87 + 0x78f, local_120 < uVar56)) {
              if (uVar65 != 0) {
                uVar56 = uVar56 - ((0x1ca10U >> ((byte)uVar65 & 0xe) & 0xe) + 0x27);
              }
              if (local_120 < uVar56) {
                uVar38 = uVar40;
                local_120 = uVar56;
                local_100 = uVar40;
                local_d8 = pDVar30;
              }
            }
          }
        }
        uVar65 = uVar65 + 1;
      } while (uVar65 != uVar60);
    }
    uVar60 = *(ulong *)(ringbuffer + uVar54);
    uVar33._0_4_ = (params->dist).alphabet_size_max;
    uVar33._4_4_ = (params->dist).alphabet_size_limit;
    uVar33 = (uVar33 & uVar60) * 0x1fe35a7bd3579bd3 >>
             ((byte)(params->dist).distance_postfix_bits & 0x3f);
    uVar56 = uVar33 & 0xffffffff;
    uVar52 = (int)uVar33 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
    puVar42 = ringbuffer + uVar54;
    uVar9 = *(ushort *)(uVar16 + uVar56 * 2);
    uVar65 = (ulong)uVar9;
    piVar1 = &(params->hasher).num_last_distances_to_check;
    uVar33 = 0;
    if (*(ulong *)piVar1 <= uVar65) {
      uVar33 = uVar65 - *(long *)piVar1;
    }
    uVar59 = (uint)(params->dist).max_distance;
    if (uVar33 < uVar65) {
      uVar40 = (ulong)(uVar53 & 7);
      do {
        uVar65 = uVar65 - 1;
        uVar25 = *(uint *)(puVar17 + (ulong)uVar52 * 2 + (ulong)((uint)uVar65 & uVar59) * 2);
        pDVar30 = (DictWord *)(position - uVar25);
        if (pDVar57 < pDVar30) break;
        if (uVar38 + uVar54 <= ringbuffer_mask) {
          uVar61 = (ulong)(uVar25 & uVar44);
          if ((uVar61 + uVar38 <= ringbuffer_mask) &&
             (ringbuffer[uVar38 + uVar54] == ringbuffer[uVar61 + uVar38])) {
            if (7 < uVar29) {
              lVar47 = 0;
              uVar55 = 0;
LAB_00110623:
              if (*(ulong *)(puVar42 + uVar55 * 8) == *(ulong *)(ringbuffer + uVar55 * 8 + uVar61))
              goto code_r0x00110635;
              uVar55 = *(ulong *)(ringbuffer + uVar55 * 8 + uVar61) ^
                       *(ulong *)(puVar42 + uVar55 * 8);
              uVar61 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                }
              }
              uVar55 = (uVar61 >> 3 & 0x1fffffff) - lVar47;
              goto LAB_00110673;
            }
            uVar64 = 0;
            puVar41 = puVar42;
LAB_0011070c:
            uVar55 = uVar64;
            if (uVar40 != 0) {
              uVar49 = uVar40 | uVar64;
              uVar51 = uVar40;
              do {
                uVar55 = uVar64;
                if (ringbuffer[uVar64 + uVar61] != *puVar41) break;
                puVar41 = puVar41 + 1;
                uVar64 = uVar64 + 1;
                uVar51 = uVar51 - 1;
                uVar55 = uVar49;
              } while (uVar51 != 0);
            }
LAB_00110673:
            if ((bVar66) &&
               ((undefined1 *)(long)(int)num_literals[(long)psVar45 * 2] <
                &((DictWord *)position)->len + uVar55)) {
              uVar55 = (long)(int)num_literals[(long)psVar45 * 2] - position;
            }
            if (3 < uVar55) {
              iVar62 = 0x1f;
              if ((uint)pDVar30 != 0) {
                for (; (uint)pDVar30 >> iVar62 == 0; iVar62 = iVar62 + -1) {
                }
              }
              uVar61 = (ulong)(iVar62 * -0x1e + 0x780) + uVar55 * 0x87;
              if (local_120 < uVar61) {
                uVar38 = uVar55;
                local_120 = uVar61;
                local_100 = uVar55;
                local_d8 = pDVar30;
              }
            }
          }
        }
      } while (uVar33 < uVar65);
    }
    *(int *)(puVar17 + (ulong)uVar52 * 2 + (ulong)(uVar59 & uVar9) * 2) = (int)position;
    *(ushort *)(uVar16 + uVar56 * 2) = uVar9 + 1;
    bVar23 = true;
    if (local_120 == 0x7e4) {
      if (!bVar22) {
        if (bVar66) {
          pDVar30 = (DictWord *)(long)(int)num_literals[(long)psVar45 * 2];
          goto LAB_00110822;
        }
        goto LAB_00110d14;
      }
      lVar47 = *(long *)&(params->dictionary).num_transforms;
      uVar38 = *(ulong *)(lVar47 + 8);
      local_168 = *(ulong *)(lVar47 + 0x10);
      if (uVar38 >> 7 <= local_168) {
        local_f0 = (int)uVar60;
        uVar60 = (ulong)((uint)(local_f0 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar18 = *(long *)(literal_context_lut + 0x78);
        iVar62 = 0;
        local_120 = 0x7e4;
        bVar66 = true;
LAB_00110a14:
        uVar38 = uVar38 + 1;
        *(ulong *)(lVar47 + 8) = uVar38;
        bVar35 = *(byte *)(lVar18 + uVar60);
        uVar33 = (ulong)bVar35;
        if ((uVar33 != 0) && (uVar33 <= uVar29)) {
          uVar65 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar60 * 2);
          lVar19 = *(long *)(literal_context_lut + 0x58);
          puVar41 = (uint8_t *)
                    (uVar65 * uVar33 + *(long *)(lVar19 + 0xa8) +
                    (ulong)*(uint *)(lVar19 + 0x20 + uVar33 * 4));
          if (7 < bVar35) {
            uVar40 = (ulong)(bVar35 & 0xfffffff8);
            lVar63 = 0;
            uVar56 = 0;
LAB_00110a79:
            if (*(ulong *)(puVar41 + uVar56 * 8) == *(ulong *)(puVar42 + uVar56 * 8))
            goto code_r0x00110a8b;
            uVar40 = *(ulong *)(puVar42 + uVar56 * 8) ^ *(ulong *)(puVar41 + uVar56 * 8);
            uVar56 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
              }
            }
            uVar56 = (uVar56 >> 3 & 0x1fffffff) - lVar63;
            goto LAB_00110acd;
          }
          uVar40 = 0;
          goto LAB_00110bc1;
        }
        goto LAB_00110ba9;
      }
      iVar62 = 0;
      local_120 = 0x7e4;
LAB_00110c25:
      bVar22 = true;
      bVar23 = true;
    }
    else {
LAB_00110d1c:
      iVar62 = 0;
    }
  }
LAB_00110d26:
  if (0x1f < uVar29) {
    pDVar48 = (params->dictionary).dict_words;
    if (pDVar48 <= position) {
      uVar52 = *(uint *)&(params->dictionary).hash_table_lengths;
      iVar26 = params[1].quality;
      iVar27 = params[1].lgwin;
LAB_00110d8b:
      uVar59 = uVar52 & 0x3fffffff;
      bVar35 = ringbuffer[(ulong)pDVar48 & ringbuffer_mask];
      bVar7 = ringbuffer[(ulong)(pDVar48 + 8) & ringbuffer_mask];
      if (uVar59 < 0x1000000) {
        puVar17 = (params->dictionary).buckets;
        uVar25 = *(uint *)(puVar17 + (ulong)uVar59 * 2);
        *(int *)(puVar17 + (ulong)uVar59 * 2) = (int)pDVar48;
        if ((pDVar48 == (DictWord *)position) && (uVar25 != 0xffffffff)) {
          uVar59 = (int)position - uVar25;
          if ((DictWord *)(ulong)uVar59 <= pDVar57) {
            lVar47 = 0;
            uVar60 = 0;
LAB_00110e1c:
            if (*(ulong *)(ringbuffer + uVar60 * 8 + uVar54) ==
                *(ulong *)(ringbuffer + uVar60 * 8 + (ulong)(uVar25 & uVar44)))
            goto code_r0x00110e2f;
            uVar38 = *(ulong *)(ringbuffer + uVar60 * 8 + (ulong)(uVar25 & uVar44)) ^
                     *(ulong *)(ringbuffer + uVar60 * 8 + uVar54);
            uVar60 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
              }
            }
            uVar38 = (uVar60 >> 3 & 0x1fffffff) - lVar47;
            goto LAB_00110e8e;
          }
        }
      }
      goto LAB_00110de8;
    }
    goto LAB_00110f17;
  }
  goto LAB_00110f22;
code_r0x0011038e:
  uVar40 = uVar40 + 1;
  lVar47 = lVar47 + -8;
  uVar61 = uVar29 & 0xfffffffffffffff8;
  puVar41 = puVar42 + (uVar29 & 0xfffffffffffffff8);
  if (uVar29 >> 3 == uVar40) goto LAB_0011048e;
  goto LAB_0011037c;
code_r0x00110635:
  uVar55 = uVar55 + 1;
  lVar47 = lVar47 + -8;
  uVar64 = uVar29 & 0xfffffffffffffff8;
  puVar41 = ringbuffer + (uVar29 & 0xfffffffffffffff8) + uVar54;
  if (uVar29 >> 3 == uVar55) goto LAB_0011070c;
  goto LAB_00110623;
code_r0x00110a8b:
  uVar56 = uVar56 + 1;
  lVar63 = lVar63 + -8;
  if (bVar35 >> 3 == uVar56) goto code_r0x00110a97;
  goto LAB_00110a79;
code_r0x00110a97:
  puVar41 = puVar41 + -lVar63;
LAB_00110bc1:
  uVar61 = uVar33 & 7;
  uVar56 = uVar40;
  if ((bVar35 & 7) != 0) {
    uVar55 = uVar40 | uVar61;
    do {
      uVar56 = uVar40;
      if (puVar42[uVar40] != *puVar41) break;
      puVar41 = puVar41 + 1;
      uVar40 = uVar40 + 1;
      uVar61 = uVar61 - 1;
      uVar56 = uVar55;
    } while (uVar61 != 0);
  }
LAB_00110acd:
  if (((uVar56 != 0) && (uVar33 < *(uint *)(literal_context_lut + 100) + uVar56)) &&
     (pDVar30 = (DictWord *)
                (&local_b0->transform +
                ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                               ((char)(uVar33 - uVar56) * '\x06' & 0x3fU)) & 0x3f) +
                 (uVar33 - uVar56) * 4 << (*(byte *)(lVar19 + uVar33) & 0x3f)) + uVar65),
     pDVar30 <= pDVar48)) {
    iVar26 = 0x1f;
    if ((uint)pDVar30 != 0) {
      for (; (uint)pDVar30 >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar33 = (uVar56 * 0x87 - (ulong)(uint)(iVar26 * 0x1e)) + 0x780;
    if (local_120 <= uVar33) {
      iVar62 = (uint)bVar35 - (int)uVar56;
      local_168 = local_168 + 1;
      *(ulong *)(lVar47 + 0x10) = local_168;
      local_120 = uVar33;
      local_100 = uVar56;
      local_d8 = pDVar30;
    }
  }
LAB_00110ba9:
  uVar60 = uVar60 + 1;
  bVar22 = !bVar66;
  bVar66 = false;
  if (bVar22) goto LAB_00110c25;
  goto LAB_00110a14;
code_r0x00110c7c:
  uVar33 = uVar33 + 1;
  lVar47 = lVar47 + -8;
  if (uVar29 >> 3 == uVar33) goto LAB_00112358;
  goto LAB_00110c6f;
code_r0x00110e2f:
  uVar60 = uVar60 + 1;
  lVar47 = lVar47 + -8;
  uVar38 = uVar29 & 0xfffffffffffffff8;
  uVar33 = uVar29 & 0xfffffffffffffff8;
  uVar65 = (ulong)(uVar53 & 7);
  if (uVar29 >> 3 == uVar60) goto joined_r0x00110e48;
  goto LAB_00110e1c;
joined_r0x00110e48:
  for (; (uVar65 != 0 &&
         (uVar38 = uVar33, ringbuffer[uVar33 + (uVar25 & uVar44)] == ringbuffer[uVar33 + uVar54]));
      uVar33 = uVar33 + 1) {
    uVar38 = uVar29;
    uVar65 = uVar65 - 1;
  }
LAB_00110e8e:
  if ((3 < uVar38) && (local_100 < uVar38)) {
    iVar12 = 0x1f;
    if (uVar59 != 0) {
      for (; uVar59 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar60 = (ulong)(iVar12 * -0x1e + 0x780) + uVar38 * 0x87;
    if (local_120 < uVar60) {
      iVar62 = 0;
      local_100 = uVar38;
      local_120 = uVar60;
      local_d8 = (DictWord *)(ulong)uVar59;
    }
  }
LAB_00110de8:
  uVar52 = ~(uint)bVar35 * iVar27 + (uint)bVar7 + uVar52 * iVar26 + 1;
  pDVar48 = (DictWord *)&pDVar48->transform;
  if (position < pDVar48) goto LAB_00110eef;
  goto LAB_00110d8b;
LAB_00110eef:
  *(uint *)&(params->dictionary).hash_table_lengths = uVar52;
LAB_00110f17:
  (params->dictionary).dict_words = (DictWord *)&((DictWord *)position)->transform;
LAB_00110f22:
  if (local_120 < 0x7e5) {
    local_d0 = local_d0 + 1;
    pDVar57 = (DictWord *)&((DictWord *)position)->transform;
    if (bVar22 && local_98 < pDVar57) {
      if (local_98 + (uint)((int)lVar37 * 4) < pDVar57) {
        pDVar48 = (DictWord *)&((DictWord *)(position + 0x10))->transform;
        if (pDVar5 <= &((DictWord *)(position + 0x10))->transform) {
          pDVar48 = pDVar5;
        }
        if (pDVar57 < pDVar48) {
          uVar16 = (params->dictionary).cutoffTransforms;
          puVar17 = (params->dictionary).hash_table_words;
          uVar54._0_4_ = (params->dist).alphabet_size_max;
          uVar54._4_4_ = (params->dist).alphabet_size_limit;
          uVar13 = (params->dist).distance_postfix_bits;
          sVar24 = (params->dist).max_distance;
          uVar14 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
          do {
            uVar60 = (*(ulong *)(ringbuffer + ((ulong)pDVar57 & ringbuffer_mask)) & uVar54) *
                     0x1fe35a7bd3579bd3 >> ((byte)uVar13 & 0x3f);
            uVar29 = uVar60 & 0xffffffff;
            uVar9 = *(ushort *)(uVar16 + uVar29 * 2);
            *(ushort *)(uVar16 + uVar29 * 2) = uVar9 + 1;
            *(int *)(puVar17 +
                    (ulong)((uint)sVar24 & (uint)uVar9) * 2 +
                    (ulong)(uint)((int)uVar60 << ((byte)uVar14 & 0x1f)) * 2) = (int)pDVar57;
            local_d0 = local_d0 + 4;
            pDVar57 = pDVar57 + 1;
          } while (pDVar57 < pDVar48);
        }
      }
      else {
        pDVar48 = (DictWord *)&((DictWord *)(position + 8))->transform;
        if (pDVar5 <= &((DictWord *)(position + 8))->transform) {
          pDVar48 = pDVar5;
        }
        if (pDVar57 < pDVar48) {
          uVar16 = (params->dictionary).cutoffTransforms;
          puVar17 = (params->dictionary).hash_table_words;
          uVar29._0_4_ = (params->dist).alphabet_size_max;
          uVar29._4_4_ = (params->dist).alphabet_size_limit;
          uVar13 = (params->dist).distance_postfix_bits;
          sVar24 = (params->dist).max_distance;
          uVar14 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
          do {
            uVar60 = (*(ulong *)(ringbuffer + ((ulong)pDVar57 & ringbuffer_mask)) & uVar29) *
                     0x1fe35a7bd3579bd3 >> ((byte)uVar13 & 0x3f);
            uVar54 = uVar60 & 0xffffffff;
            uVar9 = *(ushort *)(uVar16 + uVar54 * 2);
            *(ushort *)(uVar16 + uVar54 * 2) = uVar9 + 1;
            *(int *)(puVar17 +
                    (ulong)((uint)sVar24 & (uint)uVar9) * 2 +
                    (ulong)(uint)((int)uVar60 << ((byte)uVar14 & 0x1f)) * 2) = (int)pDVar57;
            local_d0 = local_d0 + 2;
            pDVar57 = (DictWord *)((long)pDVar57 + 2);
          } while (pDVar57 < pDVar48);
        }
      }
    }
    goto LAB_001122f2;
  }
  local_158 = local_100;
  if (bVar23) {
    uVar16 = (params->dictionary).cutoffTransforms;
    puVar17 = (params->dictionary).hash_table_words;
    uVar54 = (lVar4 + num_bytes) - position;
    uVar53 = 0;
    pDVar57 = (DictWord *)position;
    iVar26 = iVar62;
LAB_00110f70:
    uVar38 = uVar54 >> 3;
    uVar29 = uVar29 - 1;
    uVar60 = local_100 - 1;
    if (uVar29 <= local_100 - 1) {
      uVar60 = uVar29;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar60 = 0;
    }
    position = (size_t)&pDVar57->transform;
    pDVar48 = pDVar6;
    if (position < pDVar6) {
      pDVar48 = (DictWord *)position;
    }
    local_b0 = (DictWord *)(&pDVar57->transform + lVar15);
    if (pDVar6 <= (DictWord *)(&pDVar57->transform + lVar15)) {
      local_b0 = pDVar6;
    }
    pDVar30 = *(DictWord **)(literal_context_lut + 0x50);
    uVar33 = position & ringbuffer_mask;
    psVar45 = *(size_t **)backward_references;
    bVar66 = true;
    uVar52 = (uint)uVar29;
    if (psVar45 < back_refs_position) {
      puVar34 = (undefined1 *)(long)(int)num_literals[(long)psVar45 * 2];
      if (puVar34 < position) {
        psVar39 = num_literals + (long)psVar45 * 2;
        do {
          psVar45 = (size_t *)((long)psVar45 + 1);
          if (back_refs_position == psVar45) {
            *(size_t **)backward_references = psVar45;
            psVar45 = back_refs_position;
            goto LAB_001110b3;
          }
          puVar34 = (undefined1 *)(long)(int)psVar39[2];
          psVar39 = psVar39 + 2;
        } while (puVar34 < position);
        *(size_t **)backward_references = psVar45;
        bVar66 = back_refs_position <= psVar45;
      }
      else {
        psVar39 = num_literals + (long)psVar45 * 2;
        bVar66 = false;
      }
      if ((undefined1 *)position != puVar34 || bVar22) goto LAB_001110b3;
      uVar59 = (uint)psVar39[1];
      local_138 = (DictWord *)(long)(int)uVar59;
      if ((position <= (uint8_t *)(position + -(long)local_138)) ||
         (*(uint *)((long)psVar39 + 0xc) < uVar59)) {
        local_138 = (DictWord *)0x0;
        local_158 = 0;
        goto LAB_0011158b;
      }
      uVar60 = (ulong)(position + -(long)local_138) & ringbuffer_mask;
      puVar42 = ringbuffer + uVar33;
      if (7 < uVar29) {
        lVar47 = 0;
        uVar65 = 0;
LAB_00111c15:
        if (*(ulong *)(puVar42 + uVar65 * 8) == *(ulong *)(ringbuffer + uVar65 * 8 + uVar60))
        goto code_r0x00111c22;
        uVar65 = *(ulong *)(ringbuffer + uVar65 * 8 + uVar60) ^ *(ulong *)(puVar42 + uVar65 * 8);
        uVar60 = 0;
        if (uVar65 != 0) {
          for (; (uVar65 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
          }
        }
        uVar65 = (uVar60 >> 3 & 0x1fffffff) - lVar47;
        goto LAB_00111c4e;
      }
      uVar65 = 0;
      goto LAB_00111d08;
    }
LAB_001110b3:
    uVar65 = (ulong)*(int *)&(params->dictionary).words;
    if (uVar65 != 0) {
      puVar42 = ringbuffer + uVar33;
      local_160 = 0x7e4;
      uVar56 = 0;
      local_158 = 0;
      local_138 = (DictWord *)0x0;
LAB_00111115:
      pDVar50 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + uVar56 * 4);
      if (((pDVar50 <= pDVar48) && ((uint8_t *)(position + -(long)pDVar50) < position)) &&
         (uVar33 + uVar60 <= ringbuffer_mask)) {
        uVar40 = (ulong)(position + -(long)pDVar50) & ringbuffer_mask;
        if ((ringbuffer_mask < uVar40 + uVar60) ||
           (ringbuffer[uVar33 + uVar60] != ringbuffer[uVar40 + uVar60])) goto LAB_001111ac;
        uVar61 = (ulong)(uVar52 & 7);
        if (7 < uVar29) {
          lVar47 = 0;
          uVar55 = 0;
LAB_0011116e:
          if (*(ulong *)(puVar42 + uVar55 * 8) == *(ulong *)(ringbuffer + uVar55 * 8 + uVar40))
          goto code_r0x00111180;
          uVar61 = *(ulong *)(ringbuffer + uVar55 * 8 + uVar40) ^ *(ulong *)(puVar42 + uVar55 * 8);
          uVar40 = 0;
          if (uVar61 != 0) {
            for (; (uVar61 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
          uVar55 = (uVar40 >> 3 & 0x1fffffff) - lVar47;
          goto LAB_001111d0;
        }
        uVar55 = 0;
        puVar41 = puVar42;
        goto joined_r0x00111267;
      }
      goto LAB_001111ac;
    }
    local_160 = 0x7e4;
    local_138 = (DictWord *)0x0;
    local_158 = 0;
LAB_001112ba:
    uVar65 = *(ulong *)(ringbuffer + uVar33);
    uVar56._0_4_ = (params->dist).alphabet_size_max;
    uVar56._4_4_ = (params->dist).alphabet_size_limit;
    uVar56 = (uVar56 & uVar65) * 0x1fe35a7bd3579bd3 >>
             ((byte)(params->dist).distance_postfix_bits & 0x3f);
    puVar42 = ringbuffer + uVar33;
    uVar61 = uVar56 & 0xffffffff;
    uVar59 = (int)uVar56 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
    uVar9 = *(ushort *)(uVar16 + uVar61 * 2);
    uVar40 = (ulong)uVar9;
    piVar1 = &(params->hasher).num_last_distances_to_check;
    uVar56 = 0;
    if (*(ulong *)piVar1 <= uVar40) {
      uVar56 = uVar40 - *(long *)piVar1;
    }
    if (uVar56 < uVar40) {
LAB_00111377:
      uVar40 = uVar40 - 1;
      uVar25 = *(uint *)(puVar17 +
                        (ulong)uVar59 * 2 +
                        (ulong)((uint)uVar40 & (uint)(params->dist).max_distance) * 2);
      pDVar50 = (DictWord *)(position + -(ulong)uVar25);
      if (pDVar50 <= pDVar48) {
        if (uVar33 + uVar60 <= ringbuffer_mask) {
          uVar55 = (ulong)(uVar25 & uVar44);
          if ((ringbuffer_mask < uVar55 + uVar60) ||
             (ringbuffer[uVar33 + uVar60] != ringbuffer[uVar55 + uVar60])) goto LAB_0011148b;
          uVar64 = (ulong)(uVar52 & 7);
          if (7 < uVar29) {
            lVar47 = 0;
            uVar51 = 0;
LAB_001113d5:
            if (*(ulong *)(puVar42 + uVar51 * 8) == *(ulong *)(ringbuffer + uVar51 * 8 + uVar55))
            goto code_r0x001113e7;
            uVar64 = *(ulong *)(ringbuffer + uVar51 * 8 + uVar55) ^ *(ulong *)(puVar42 + uVar51 * 8)
            ;
            uVar55 = 0;
            if (uVar64 != 0) {
              for (; (uVar64 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
              }
            }
            uVar51 = (uVar55 >> 3 & 0x1fffffff) - lVar47;
            goto LAB_00111422;
          }
          uVar51 = 0;
          puVar41 = puVar42;
          goto joined_r0x001114a8;
        }
        goto LAB_0011148b;
      }
    }
LAB_001114cb:
    *(int *)(puVar17 +
            (ulong)uVar59 * 2 + (ulong)((uint)(params->dist).max_distance & (uint)uVar9) * 2) =
         (int)position;
    *(ushort *)(uVar16 + uVar61 * 2) = uVar9 + 1;
    bVar23 = false;
    bVar35 = 1;
    if (local_160 == 0x7e4) {
      if (bVar22) {
        lVar47 = *(long *)&(params->dictionary).num_transforms;
        uVar60 = *(ulong *)(lVar47 + 8);
        local_88 = *(ulong *)(lVar47 + 0x10);
        if (uVar60 >> 7 <= local_88) {
          local_78 = (int)uVar65;
          uVar65 = (ulong)((uint)(local_78 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          lVar18 = *(long *)(literal_context_lut + 0x78);
          iVar62 = 0;
          local_160 = 0x7e4;
          bVar66 = true;
LAB_00111761:
          uVar60 = uVar60 + 1;
          *(ulong *)(lVar47 + 8) = uVar60;
          bVar35 = *(byte *)(lVar18 + uVar65);
          uVar56 = (ulong)bVar35;
          if ((uVar56 != 0) && (uVar56 <= uVar29)) {
            uVar40 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar65 * 2);
            lVar19 = *(long *)(literal_context_lut + 0x58);
            puVar41 = (uint8_t *)
                      (uVar40 * uVar56 + *(long *)(lVar19 + 0xa8) +
                      (ulong)*(uint *)(lVar19 + 0x20 + uVar56 * 4));
            if (7 < bVar35) {
              uVar55 = (ulong)(bVar35 & 0xfffffff8);
              lVar63 = 0;
              uVar61 = 0;
LAB_001117c1:
              if (*(ulong *)(puVar41 + uVar61 * 8) == *(ulong *)(puVar42 + uVar61 * 8))
              goto code_r0x001117d3;
              uVar55 = *(ulong *)(puVar42 + uVar61 * 8) ^ *(ulong *)(puVar41 + uVar61 * 8);
              uVar61 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                }
              }
              uVar61 = (uVar61 >> 3 & 0x1fffffff) - lVar63;
              goto LAB_00111805;
            }
            uVar55 = 0;
            goto LAB_00111914;
          }
          goto LAB_001118bd;
        }
        local_160 = 0x7e4;
        iVar62 = 0;
LAB_00111953:
        bVar35 = 1;
        bVar23 = false;
      }
      else {
LAB_0011158b:
        local_160 = 0x7e4;
        bVar35 = 1;
        if ((bVar66) ||
           ((undefined1 *)position != (undefined1 *)(long)(int)num_literals[(long)psVar45 * 2])) {
LAB_001116ee:
          bVar23 = false;
        }
        else {
          uVar59 = (uint)num_literals[(long)psVar45 * 2 + 1];
          if ((int)uVar59 <= *(int *)((long)num_literals + (long)psVar45 * 0x10 + 0xc))
          goto LAB_001116ee;
          uVar25 = *(uint *)((long)num_literals + (long)psVar45 * 0x10 + 4);
          uVar60 = (ulong)uVar25;
          bVar23 = true;
          if (uVar25 - 4 < 0x15 && (int)uVar59 < 0x7ffffffd) {
            uVar28 = ~(uint)pDVar48 + uVar59;
            lVar47 = *(long *)(literal_context_lut + 0x58);
            iVar62 = (int)uVar28 >> (*(byte *)(lVar47 + uVar60) & 0x1f);
            if (iVar62 < *(int *)(literal_context_lut + 0x60)) {
              uVar10 = *(uint *)(lVar47 + 0x20 + uVar60 * 4);
              uVar11 = kBitMask[*(byte *)(lVar47 + uVar60)];
              lVar47 = *(long *)(lVar47 + 0xa8);
              uVar31 = BrotliGetTransforms();
              pvVar32 = malloc(uVar60 * 10);
              iVar62 = BrotliTransformDictionaryWord
                                 (pvVar32,(ulong)uVar10 + lVar47 +
                                          (long)(int)((uVar28 & uVar11) * uVar25),uVar25,uVar31,
                                  iVar62);
              sVar46 = (size_t)iVar62;
              iVar27 = bcmp(ringbuffer + uVar33,pvVar32,sVar46);
              if (iVar27 == 0) {
                iVar27 = 0x1f;
                if (uVar59 != 0) {
                  for (; uVar59 >> iVar27 == 0; iVar27 = iVar27 + -1) {
                  }
                }
                local_160 = (ulong)(iVar27 * -0x1e + 0x780) + sVar46 * 0x87;
                iVar62 = uVar25 - iVar62;
                local_158 = sVar46;
                local_138 = (DictWord *)(long)(int)uVar59;
              }
              else {
                iVar62 = 0;
              }
              bVar35 = 0;
              auVar67 = _DAT_0013b100;
              goto LAB_0011195b;
            }
          }
          bVar35 = 0;
          bVar23 = true;
        }
        iVar62 = 0;
      }
    }
    else {
      iVar62 = 0;
    }
    goto LAB_0011195b;
  }
LAB_00111f28:
  if (local_b0 < local_d8) {
LAB_00111f4e:
    puVar34 = (undefined1 *)((long)&local_d8[3].idx + 1);
LAB_00111f53:
    if ((local_d8 <= local_b0) && (puVar34 != (undefined1 *)0x0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      pvVar32 = (hasher->common).extra;
      *(void **)((long)&(hasher->common).extra + 4) = pvVar32;
      iVar26 = (int)local_d8;
      *(int *)&(hasher->common).extra = iVar26;
      uVar53 = *(uint *)&(params->dictionary).words;
      if (4 < (int)uVar53) {
        *(int *)&(hasher->common).dict_num_matches = iVar26 + auVar67._0_4_;
        *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar26 + auVar67._4_4_;
        (hasher->common).params.type = iVar26 + auVar67._8_4_;
        (hasher->common).params.bucket_bits = iVar26 + auVar67._12_4_;
        (hasher->common).params.block_bits = iVar26 + -3;
        (hasher->common).params.hash_len = iVar26 + 3;
        if (10 < uVar53) {
          iVar26 = (int)pvVar32;
          (hasher->common).params.num_last_distances_to_check = iVar26 + auVar67._0_4_;
          (hasher->common).is_prepared_ = iVar26 + auVar67._4_4_;
          *(int *)&hasher->privat = iVar26 + auVar67._8_4_;
          *(int *)((long)&hasher->privat + 4) = iVar26 + auVar67._12_4_;
          (hasher->privat)._H5.block_size_ = CONCAT44(iVar26 + 3,iVar26 + -3);
        }
      }
    }
  }
  else {
    pDVar57 = (DictWord *)(long)*(int *)&(hasher->common).extra;
    if (local_d8 != pDVar57) {
      pDVar48 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + 4);
      puVar34 = (undefined1 *)0x1;
      if (local_d8 != pDVar48) {
        uVar29 = (long)local_d8 + (3 - (long)pDVar57);
        if (uVar29 < 7) {
          bVar35 = (byte)((int)uVar29 << 2);
          uVar53 = 0x9750468;
        }
        else {
          uVar29 = (long)local_d8 + (3 - (long)pDVar48);
          if (6 < uVar29) {
            puVar34 = (undefined1 *)0x2;
            if ((local_d8 != (DictWord *)(long)(int)(hasher->common).dict_num_lookups) &&
               (puVar34 = (undefined1 *)0x3,
               local_d8 != (DictWord *)(long)*(int *)((long)&(hasher->common).dict_num_lookups + 4))
               ) goto LAB_00111f4e;
            goto LAB_00111f53;
          }
          bVar35 = (byte)((int)uVar29 << 2);
          uVar53 = 0xfdb1ace;
        }
        puVar34 = (undefined1 *)(ulong)(uVar53 >> (bVar35 & 0x1f) & 0xf);
      }
      goto LAB_00111f53;
    }
    puVar34 = (undefined1 *)0x0;
  }
  uVar53 = (uint)local_d0;
  *(uint *)local_a8 = uVar53;
  *(uint *)((long)local_a8 + 4) = iVar62 << 0x19 | (uint)local_158;
  puVar2 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x44) + 0x10);
  uVar44 = 0;
  if (puVar2 <= puVar34) {
    bVar35 = (byte)*(uint *)(literal_context_lut + 0x40);
    puVar58 = puVar34 + ((4L << (bVar35 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x44)) +
                        -0x10;
    uVar44 = 0x1f;
    uVar52 = (uint)puVar58;
    if (uVar52 != 0) {
      for (; uVar52 >> uVar44 == 0; uVar44 = uVar44 - 1) {
      }
    }
    uVar44 = (uVar44 ^ 0xffffffe0) + 0x1f;
    uVar29 = (ulong)(((ulong)puVar58 >> ((ulong)uVar44 & 0x3f) & 1) != 0);
    lVar47 = (ulong)uVar44 - (ulong)*(uint *)(literal_context_lut + 0x40);
    puVar34 = (undefined1 *)
              ((ulong)(puVar2 + (uVar29 + lVar47 * 2 + 0xfffe << (bVar35 & 0x3f)) +
                                (ulong)(~(-1 << (bVar35 & 0x1f)) & uVar52)) | lVar47 * 0x400);
    uVar44 = (uint)((long)puVar58 - (uVar29 + 2 << ((byte)uVar44 & 0x3f)) >> (bVar35 & 0x3f));
  }
  *(short *)((long)local_a8 + 0xe) = (short)puVar34;
  *(uint *)(local_a8 + 1) = uVar44;
  if (5 < local_d0) {
    if (local_d0 < 0x82) {
      uVar53 = 0x1f;
      uVar44 = (uint)(local_d0 - 2);
      if (uVar44 != 0) {
        for (; uVar44 >> uVar53 == 0; uVar53 = uVar53 - 1) {
        }
      }
      uVar53 = (int)(local_d0 - 2 >> ((char)(uVar53 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar53 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_d0 < 0x842) {
      uVar44 = 0x1f;
      if (uVar53 - 0x42 != 0) {
        for (; uVar53 - 0x42 >> uVar44 == 0; uVar44 = uVar44 - 1) {
        }
      }
      uVar53 = (uVar44 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar53 = 0x15;
      if (0x1841 < local_d0) {
        uVar53 = (uint)(ushort)(0x17 - (local_d0 < 0x5842));
      }
    }
  }
  uVar44 = iVar62 + (uint)local_158;
  if (uVar44 < 10) {
    uVar52 = uVar44 - 2;
  }
  else if (uVar44 < 0x86) {
    uVar44 = uVar44 - 6;
    uVar52 = 0x1f;
    if (uVar44 != 0) {
      for (; uVar44 >> uVar52 == 0; uVar52 = uVar52 - 1) {
      }
    }
    uVar52 = (uVar44 >> ((char)(uVar52 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar52 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar52 = 0x17;
    if (uVar44 < 0x846) {
      uVar52 = 0x1f;
      if (uVar44 - 0x46 != 0) {
        for (; uVar44 - 0x46 >> uVar52 == 0; uVar52 = uVar52 - 1) {
        }
      }
      uVar52 = (uVar52 ^ 0xffe0) + 0x2c;
    }
  }
  uVar9 = (ushort)uVar52;
  sVar43 = (uVar9 & 7) + ((ushort)uVar53 & 7) * 8;
  if (((((ulong)puVar34 & 0x3ff) == 0) && ((ushort)uVar53 < 8)) && (uVar9 < 0x10)) {
    if (7 < uVar9) {
      sVar43 = sVar43 + 0x40;
    }
  }
  else {
    iVar62 = ((uVar53 & 0xffff) >> 3) * 3 + ((uVar52 & 0xffff) >> 3);
    sVar43 = sVar43 + ((ushort)(0x520d40 >> ((char)iVar62 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar62 * 0x40 + 0x40;
  }
  *(short *)((long)local_a8 + 0xc) = sVar43;
  *num_commands = *num_commands + local_d0;
  pDVar57 = (DictWord *)(&((DictWord *)position)->len + local_158);
  pDVar48 = pDVar36;
  if (pDVar57 < pDVar36) {
    pDVar48 = pDVar57;
  }
  pDVar30 = (DictWord *)&((DictWord *)position)->idx;
  if (local_d8 < (DictWord *)(local_158 >> 2)) {
    pDVar50 = pDVar57 + -(long)local_d8;
    if (pDVar57 + -(long)local_d8 < pDVar30) {
      pDVar50 = pDVar30;
    }
    pDVar30 = pDVar50;
    if (pDVar48 < pDVar50) {
      pDVar30 = pDVar48;
    }
  }
  local_98 = &((DictWord *)position)->len + lVar37 + local_158 * 2;
  local_a8 = local_a8 + 2;
  if (pDVar30 < pDVar48) {
    uVar16 = (params->dictionary).cutoffTransforms;
    puVar17 = (params->dictionary).hash_table_words;
    uVar60._0_4_ = (params->dist).alphabet_size_max;
    uVar60._4_4_ = (params->dist).alphabet_size_limit;
    uVar13 = (params->dist).distance_postfix_bits;
    sVar24 = (params->dist).max_distance;
    uVar14 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
    do {
      uVar54 = (*(ulong *)(ringbuffer + ((ulong)pDVar30 & ringbuffer_mask)) & uVar60) *
               0x1fe35a7bd3579bd3 >> ((byte)uVar13 & 0x3f);
      uVar29 = uVar54 & 0xffffffff;
      uVar9 = *(ushort *)(uVar16 + uVar29 * 2);
      *(ushort *)(uVar16 + uVar29 * 2) = uVar9 + 1;
      *(int *)(puVar17 +
              (ulong)((uint)sVar24 & (uint)uVar9) * 2 +
              (ulong)(uint)((int)uVar54 << ((byte)uVar14 & 0x1f)) * 2) = (int)pDVar30;
      pDVar30 = (DictWord *)&pDVar30->transform;
    } while (pDVar48 != pDVar30);
  }
  local_d0 = 0;
LAB_001122f2:
  position = (size_t)pDVar57;
  if (pDVar3 <= (DictWord *)(position + 8)) goto LAB_00112398;
  goto LAB_0011014a;
code_r0x00111c22:
  uVar65 = uVar65 + 1;
  lVar47 = lVar47 + -8;
  if (uVar38 == uVar65) goto code_r0x00111c33;
  goto LAB_00111c15;
code_r0x00111c33:
  puVar42 = puVar42 + -lVar47;
  uVar65 = -lVar47;
LAB_00111d08:
  uVar56 = uVar29 & 7;
  for (; (uVar56 != 0 && (ringbuffer[uVar65 + uVar60] == *puVar42)); uVar65 = uVar65 + 1) {
    puVar42 = puVar42 + 1;
    uVar56 = uVar56 - 1;
  }
LAB_00111c4e:
  local_158 = (ulong)*(int *)((long)num_literals + (long)psVar45 * 0x10 + 4);
  if (uVar65 < local_158) {
    local_158 = uVar65;
  }
  iVar62 = 0x1f;
  if (uVar59 != 0) {
    for (; uVar59 >> iVar62 == 0; iVar62 = iVar62 + -1) {
    }
  }
  local_160 = (ulong)(iVar62 * -0x1e + 0x780) + local_158 * 0x87;
  bVar35 = 0;
  bVar23 = true;
  iVar62 = 0;
LAB_0011195b:
  if (uVar29 < 0x20) goto LAB_00111b5a;
  pDVar30 = (params->dictionary).dict_words;
  if (pDVar30 <= position) {
    uVar59 = *(uint *)&(params->dictionary).hash_table_lengths;
    iVar27 = params[1].quality;
    iVar12 = params[1].lgwin;
LAB_001119b6:
    uVar25 = uVar59 & 0x3fffffff;
    bVar7 = ringbuffer[(ulong)pDVar30 & ringbuffer_mask];
    bVar8 = ringbuffer[(ulong)(pDVar30 + 8) & ringbuffer_mask];
    if (uVar25 < 0x1000000) {
      puVar20 = (params->dictionary).buckets;
      uVar28 = *(uint *)(puVar20 + (ulong)uVar25 * 2);
      *(int *)(puVar20 + (ulong)uVar25 * 2) = (int)pDVar30;
      if ((pDVar30 == (DictWord *)position) && (uVar28 != 0xffffffff)) {
        uVar25 = (int)position - uVar28;
        if ((DictWord *)(ulong)uVar25 <= pDVar48) {
          lVar47 = 0;
          uVar60 = 0;
LAB_00111a40:
          if (*(ulong *)(ringbuffer + uVar60 * 8 + uVar33) ==
              *(ulong *)(ringbuffer + uVar60 * 8 + (ulong)(uVar28 & uVar44))) goto code_r0x00111a52;
          uVar65 = *(ulong *)(ringbuffer + uVar60 * 8 + (ulong)(uVar28 & uVar44)) ^
                   *(ulong *)(ringbuffer + uVar60 * 8 + uVar33);
          uVar60 = 0;
          if (uVar65 != 0) {
            for (; (uVar65 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
            }
          }
          uVar65 = (uVar60 >> 3 & 0x1fffffff) - lVar47;
          goto LAB_00111abf;
        }
      }
    }
    goto LAB_00111a12;
  }
LAB_00111b42:
  (params->dictionary).dict_words = (DictWord *)&pDVar57->idx;
LAB_00111b5a:
  if (!bVar23 && local_160 < local_120 + 0xaf) {
    local_158 = local_100;
    position = (size_t)pDVar57;
    local_b0 = (DictWord *)(&pDVar57->len + lVar15);
    iVar62 = iVar26;
    if (pDVar6 <= (DictWord *)(&pDVar57->len + lVar15)) {
      local_b0 = pDVar6;
    }
    goto LAB_00111f28;
  }
  local_d0 = local_d0 + 1;
  local_d8 = local_138;
  if (!(bool)(bVar35 & uVar53 < 3)) goto LAB_00111f28;
  uVar53 = uVar53 + 1;
  pDVar48 = pDVar57 + 2;
  uVar54 = uVar54 - 1;
  local_120 = local_160;
  local_100 = local_158;
  pDVar57 = (DictWord *)position;
  iVar26 = iVar62;
  if (pDVar3 <= &pDVar48->transform) goto LAB_00111f28;
  goto LAB_00110f70;
code_r0x00111180:
  uVar55 = uVar55 + 1;
  lVar47 = lVar47 + -8;
  if (uVar38 == uVar55) goto code_r0x00111191;
  goto LAB_0011116e;
code_r0x00111191:
  uVar55 = -lVar47;
  puVar41 = puVar42 + -lVar47;
joined_r0x00111267:
  for (; (uVar61 != 0 && (ringbuffer[uVar55 + uVar40] == *puVar41)); uVar55 = uVar55 + 1) {
    puVar41 = puVar41 + 1;
    uVar61 = uVar61 - 1;
  }
LAB_001111d0:
  if ((!bVar22 && !bVar66) &&
     ((undefined1 *)(long)(int)num_literals[(long)psVar45 * 2] < (uint8_t *)(position + uVar55))) {
    uVar55 = (long)(int)num_literals[(long)psVar45 * 2] - position;
  }
  if (((2 < uVar55) || ((uVar56 < 2 && (uVar55 == 2)))) &&
     (uVar40 = uVar55 * 0x87 + 0x78f, local_160 < uVar40)) {
    if (uVar56 != 0) {
      uVar40 = uVar40 - ((0x1ca10U >> ((byte)uVar56 & 0xe) & 0xe) + 0x27);
    }
    if (local_160 < uVar40) {
      uVar60 = uVar55;
      local_160 = uVar40;
      local_158 = uVar55;
      local_138 = pDVar50;
    }
  }
LAB_001111ac:
  uVar56 = uVar56 + 1;
  if (uVar56 == uVar65) goto LAB_001112ba;
  goto LAB_00111115;
code_r0x001113e7:
  uVar51 = uVar51 + 1;
  lVar47 = lVar47 + -8;
  if (uVar38 == uVar51) goto code_r0x001113f8;
  goto LAB_001113d5;
code_r0x001113f8:
  uVar51 = -lVar47;
  puVar41 = puVar42 + -lVar47;
joined_r0x001114a8:
  for (; (uVar64 != 0 && (ringbuffer[uVar51 + uVar55] == *puVar41)); uVar51 = uVar51 + 1) {
    uVar64 = uVar64 - 1;
    puVar41 = puVar41 + 1;
  }
LAB_00111422:
  if ((!bVar22 && !bVar66) &&
     ((undefined1 *)(long)(int)num_literals[(long)psVar45 * 2] < (uint8_t *)(position + uVar51))) {
    uVar51 = (long)(int)num_literals[(long)psVar45 * 2] - position;
  }
  if (3 < uVar51) {
    iVar62 = 0x1f;
    if ((uint)pDVar50 != 0) {
      for (; (uint)pDVar50 >> iVar62 == 0; iVar62 = iVar62 + -1) {
      }
    }
    uVar55 = (ulong)(iVar62 * -0x1e + 0x780) + uVar51 * 0x87;
    if (local_160 < uVar55) {
      uVar60 = uVar51;
      local_160 = uVar55;
      local_158 = uVar51;
      local_138 = pDVar50;
    }
  }
LAB_0011148b:
  if (uVar40 <= uVar56) goto LAB_001114cb;
  goto LAB_00111377;
code_r0x001117d3:
  uVar61 = uVar61 + 1;
  lVar63 = lVar63 + -8;
  if (bVar35 >> 3 == uVar61) goto code_r0x001117df;
  goto LAB_001117c1;
code_r0x001117df:
  puVar41 = puVar41 + -lVar63;
LAB_00111914:
  uVar64 = uVar56 & 7;
  uVar61 = uVar55;
  if ((bVar35 & 7) != 0) {
    uVar51 = uVar55 | uVar64;
    do {
      uVar61 = uVar55;
      if (puVar42[uVar55] != *puVar41) break;
      puVar41 = puVar41 + 1;
      uVar55 = uVar55 + 1;
      uVar64 = uVar64 - 1;
      uVar61 = uVar51;
    } while (uVar64 != 0);
  }
LAB_00111805:
  if (((uVar61 != 0) && (uVar56 < *(uint *)(literal_context_lut + 100) + uVar61)) &&
     (pDVar50 = (DictWord *)
                (&local_b0->transform +
                ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                               ((char)(uVar56 - uVar61) * '\x06' & 0x3fU)) & 0x3f) +
                 (uVar56 - uVar61) * 4 << (*(byte *)(lVar19 + uVar56) & 0x3f)) + uVar40),
     pDVar50 <= pDVar30)) {
    iVar27 = 0x1f;
    if ((uint)pDVar50 != 0) {
      for (; (uint)pDVar50 >> iVar27 == 0; iVar27 = iVar27 + -1) {
      }
    }
    uVar56 = (uVar61 * 0x87 - (ulong)(uint)(iVar27 * 0x1e)) + 0x780;
    if (local_160 <= uVar56) {
      iVar62 = (uint)bVar35 - (int)uVar61;
      local_88 = local_88 + 1;
      *(ulong *)(lVar47 + 0x10) = local_88;
      local_160 = uVar56;
      local_158 = uVar61;
      local_138 = pDVar50;
    }
  }
LAB_001118bd:
  uVar65 = uVar65 + 1;
  bVar23 = !bVar66;
  bVar66 = false;
  if (bVar23) goto LAB_00111953;
  goto LAB_00111761;
code_r0x00111a52:
  uVar60 = uVar60 + 1;
  lVar47 = lVar47 + -8;
  if (uVar38 == uVar60) goto code_r0x00111a63;
  goto LAB_00111a40;
code_r0x00111a63:
  uVar60 = (ulong)(uVar52 & 7);
  for (uVar65 = -lVar47;
      (uVar60 != 0 && (ringbuffer[uVar65 + (uVar28 & uVar44)] == ringbuffer[uVar65 + uVar33]));
      uVar65 = uVar65 + 1) {
    uVar60 = uVar60 - 1;
  }
LAB_00111abf:
  if ((3 < uVar65) && (local_158 < uVar65)) {
    iVar21 = 0x1f;
    if (uVar25 != 0) {
      for (; uVar25 >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    uVar60 = (ulong)(iVar21 * -0x1e + 0x780) + uVar65 * 0x87;
    if (local_160 < uVar60) {
      iVar62 = 0;
      local_160 = uVar60;
      local_158 = uVar65;
      local_138 = (DictWord *)(ulong)uVar25;
    }
  }
LAB_00111a12:
  uVar59 = ~(uint)bVar7 * iVar12 + (uint)bVar8 + uVar59 * iVar27 + 1;
  pDVar30 = (DictWord *)&pDVar30->transform;
  if (position < pDVar30) goto LAB_00111b20;
  goto LAB_001119b6;
LAB_00111b20:
  *(uint *)&(params->dictionary).hash_table_lengths = uVar59;
  goto LAB_00111b42;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}